

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t unpack_16bit_4chan_interleave(exr_decode_pipeline_t *decode)

{
  int iVar1;
  int iVar2;
  exr_coding_channel_info_t *peVar3;
  void *pvVar4;
  int iVar5;
  long lVar6;
  void *pvVar7;
  uint64_t *outall;
  uint8_t *puVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  void *pvVar12;
  void *pvVar13;
  ulong uVar14;
  
  pvVar4 = decode->unpacked_buffer;
  peVar3 = decode->channels;
  iVar1 = peVar3->width;
  lVar6 = (long)iVar1;
  iVar5 = (decode->chunk).height;
  iVar2 = peVar3->user_line_stride;
  puVar8 = (peVar3->field_12).decode_to_ptr;
  lVar9 = (long)(iVar1 * 8);
  iVar10 = 0;
  iVar11 = 0;
  if (0 < iVar1) {
    iVar11 = iVar1;
  }
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  pvVar12 = (void *)(lVar6 * 6 + (long)pvVar4);
  pvVar13 = (void *)((long)pvVar4 + lVar6 * 4);
  pvVar7 = (void *)((long)pvVar4 + lVar6 * 2);
  for (; iVar10 != iVar5; iVar10 = iVar10 + 1) {
    for (uVar14 = 0; (uint)(iVar11 * 2) != uVar14; uVar14 = uVar14 + 2) {
      *(ulong *)(puVar8 + uVar14 * 4) =
           CONCAT26(*(undefined2 *)((long)pvVar12 + uVar14),
                    CONCAT24(*(undefined2 *)((long)pvVar13 + uVar14),
                             CONCAT22(*(undefined2 *)((long)pvVar7 + uVar14),
                                      *(undefined2 *)((long)pvVar4 + uVar14))));
    }
    pvVar4 = (void *)((long)pvVar4 + lVar9);
    puVar8 = puVar8 + iVar2;
    pvVar12 = (void *)((long)pvVar12 + lVar9);
    pvVar13 = (void *)((long)pvVar13 + lVar9);
    pvVar7 = (void *)((long)pvVar7 + lVar9);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_4chan_interleave (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2, *in3;
    uint8_t*        out0;
    int             w, h;
    int             linc0;
    /* TODO: can do this with sse and do 2 outpixels at once */
    union
    {
        struct
        {
            uint16_t a;
            uint16_t b;
            uint16_t g;
            uint16_t r;
        };
        uint64_t allc;
    } combined;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;

    /* interleaving case, we can do this! */
    for (int y = 0; y < h; ++y)
    {
        uint64_t* outall = (uint64_t*) out0;
        in0              = (const uint16_t*) srcbuffer;
        in1              = in0 + w;
        in2              = in1 + w;
        in3              = in2 + w;

        srcbuffer += w * 8; // 4 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            combined.a = one_to_native16 (in0[x]);
            combined.b = one_to_native16 (in1[x]);
            combined.g = one_to_native16 (in2[x]);
            combined.r = one_to_native16 (in3[x]);
            outall[x]  = combined.allc;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}